

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_irExprList * build_ir_exprlist(Context_conflict *ctx,MOJOSHADER_astArguments *args)

{
  MOJOSHADER_irExpression *pMVar1;
  MOJOSHADER_irExprList *pMVar2;
  MOJOSHADER_irExprList *pMVar3;
  
  pMVar3 = (MOJOSHADER_irExprList *)0x0;
  for (; args != (MOJOSHADER_astArguments *)0x0; args = args->next) {
    pMVar1 = build_ir_expr(ctx,args->argument);
    pMVar2 = (MOJOSHADER_irExprList *)Malloc(ctx,0x28);
    if (pMVar2 != (MOJOSHADER_irExprList *)0x0) {
      (pMVar2->ir).type = MOJOSHADER_IR_EXPRLIST;
      (pMVar2->ir).filename = ctx->sourcefile;
      (pMVar2->ir).line = ctx->sourceline;
      pMVar2->expr = pMVar1;
      pMVar2->next = (MOJOSHADER_irExprList *)0x0;
    }
    if (pMVar3 != (MOJOSHADER_irExprList *)0x0) {
      pMVar3->next = pMVar2;
      pMVar2 = pMVar3;
    }
    pMVar3 = pMVar2;
  }
  return pMVar3;
}

Assistant:

static MOJOSHADER_irExprList *build_ir_exprlist(Context *ctx, MOJOSHADER_astArguments *args)
{
    MOJOSHADER_irExprList *retval = NULL;
    MOJOSHADER_irExprList *prev = NULL;

    while (args != NULL)
    {
        assert((retval && prev) || ((!retval) && (!prev)));

        MOJOSHADER_irExprList *item = new_ir_exprlist(ctx, build_ir_expr(ctx, args->argument));
        if (prev == NULL)
            prev = retval = item;
        else
            prev->next = item;

        args = args->next;
    } // while

    return retval;
}